

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<kj::AppendableFile,_std::nullptr_t> __thiscall
kj::Directory::appendFile(Directory *this,PathPtr path,WriteMode mode)

{
  bool bVar1;
  Own<kj::AppendableFile,_std::nullptr_t> *pOVar2;
  Clock *clock;
  undefined4 in_register_0000000c;
  AppendableFile *extraout_RDX;
  AppendableFile *extraout_RDX_00;
  AppendableFile *pAVar3;
  WriteMode in_R8D;
  Own<kj::AppendableFile,_std::nullptr_t> OVar4;
  Own<kj::File,_std::nullptr_t> local_c8;
  Own<const_kj::File,_std::nullptr_t> local_b8;
  Fault local_a8;
  Fault f_4;
  Fault f_3;
  Fault f_2;
  Fault f_1;
  Own<kj::AppendableFile,_std::nullptr_t> *f;
  Maybe<kj::Own<kj::AppendableFile,_std::nullptr_t>_> local_50;
  undefined1 local_40 [8];
  OwnOwn<kj::AppendableFile,_std::nullptr_t> _f595;
  WriteMode mode_local;
  Directory *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)CONCAT44(in_register_0000000c,mode);
  this_local = (Directory *)path.parts.size_;
  _f595.value.ptr._4_4_ = in_R8D;
  path_local.parts.size_ = (size_t)this;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x80))
            (&local_50,path.parts.ptr,this_local,CONCAT44(in_register_0000000c,mode),in_R8D);
  kj::_::readMaybe<kj::AppendableFile,decltype(nullptr)>((_ *)local_40,&local_50);
  Maybe<kj::Own<kj::AppendableFile,_std::nullptr_t>_>::~Maybe(&local_50);
  pOVar2 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_40);
  if (pOVar2 == (Own<kj::AppendableFile,_std::nullptr_t> *)0x0) {
    bVar1 = has<kj::WriteMode,void>(_f595.value.ptr._4_4_,CREATE);
    if ((!bVar1) || (bVar1 = has<kj::WriteMode,void>(_f595.value.ptr._4_4_,MODIFY), bVar1)) {
      bVar1 = has<kj::WriteMode,void>(_f595.value.ptr._4_4_,MODIFY);
      if ((!bVar1) || (bVar1 = has<kj::WriteMode,void>(_f595.value.ptr._4_4_,CREATE), bVar1)) {
        bVar1 = has<kj::WriteMode,void>(_f595.value.ptr._4_4_,MODIFY);
        if ((bVar1) || (bVar1 = has<kj::WriteMode,void>(_f595.value.ptr._4_4_,CREATE), bVar1)) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55],kj::PathPtr&>
                    (&local_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x25d,FAILED,(char *)0x0,
                     "\"tryAppendFile() returned null despite no preconditions\", path",
                     (char (*) [55])"tryAppendFile() returned null despite no preconditions",
                     (PathPtr *)&this_local);
          kj::_::Debug::Fault::~Fault(&local_a8);
        }
        else {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58],kj::PathPtr&>
                    (&f_4,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x25a,FAILED,(char *)0x0,
                     "\"neither WriteMode::CREATE nor WriteMode::MODIFY was given\", path",
                     (char (*) [58])"neither WriteMode::CREATE nor WriteMode::MODIFY was given",
                     (PathPtr *)&this_local);
          kj::_::Debug::Fault::~Fault(&f_4);
        }
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                  (&f_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,600,FAILED,(char *)0x0,"\"file does not exist\", path",
                   (char (*) [20])"file does not exist",(PathPtr *)&this_local);
        kj::_::Debug::Fault::~Fault(&f_3);
      }
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                (&f_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x256,FAILED,(char *)0x0,"\"file already exists\", path",
                 (char (*) [20])"file already exists",(PathPtr *)&this_local);
      kj::_::Debug::Fault::~Fault(&f_2);
    }
    bVar1 = false;
  }
  else {
    pOVar2 = kj::_::OwnOwn<kj::AppendableFile,_std::nullptr_t>::operator*
                       ((OwnOwn<kj::AppendableFile,_std::nullptr_t> *)local_40);
    pOVar2 = mv<kj::Own<kj::AppendableFile,decltype(nullptr)>>(pOVar2);
    Own<kj::AppendableFile,_std::nullptr_t>::Own
              ((Own<kj::AppendableFile,_std::nullptr_t> *)this,pOVar2);
    bVar1 = true;
  }
  kj::_::OwnOwn<kj::AppendableFile,_std::nullptr_t>::~OwnOwn
            ((OwnOwn<kj::AppendableFile,_std::nullptr_t> *)local_40);
  pAVar3 = extraout_RDX;
  if (!bVar1) {
    clock = nullClock();
    newInMemoryFile((kj *)&local_c8,clock);
    Own<const_kj::File,_std::nullptr_t>::Own(&local_b8,&local_c8);
    newFileAppender((kj *)this,&local_b8);
    Own<const_kj::File,_std::nullptr_t>::~Own(&local_b8);
    Own<kj::File,_std::nullptr_t>::~Own(&local_c8);
    pAVar3 = extraout_RDX_00;
  }
  OVar4.ptr = pAVar3;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

Own<AppendableFile> Directory::appendFile(PathPtr path, WriteMode mode) const {
  KJ_IF_SOME(f, tryAppendFile(path, mode)) {
    return kj::mv(f);
  } else if (has(mode, WriteMode::CREATE) && !has(mode, WriteMode::MODIFY)) {
    KJ_FAIL_REQUIRE("file already exists", path) { break; }
  } else if (has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_REQUIRE("file does not exist", path) { break; }
  } else if (!has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_ASSERT("neither WriteMode::CREATE nor WriteMode::MODIFY was given", path) { break; }
  } else {
    // Shouldn't happen.
    KJ_FAIL_ASSERT("tryAppendFile() returned null despite no preconditions", path) { break; }